

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleString.cpp
# Opt level: O2

SimpleString __thiscall SimpleString::subString(SimpleString *this,size_t beginPos,size_t amount)

{
  size_t sVar1;
  size_t sVar2;
  ulong in_RCX;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  SimpleString SVar3;
  
  sVar1 = size((SimpleString *)beginPos);
  if (sVar1 - 1 < amount) {
    SimpleString(this,"");
    sVar1 = extraout_RDX;
  }
  else {
    SimpleString(this,(char *)(amount + *(long *)beginPos));
    sVar2 = size(this);
    sVar1 = extraout_RDX_00;
    if (in_RCX < sVar2) {
      this->buffer_[in_RCX] = '\0';
    }
  }
  SVar3.bufferSize_ = sVar1;
  SVar3.buffer_ = (char *)this;
  return SVar3;
}

Assistant:

SimpleString SimpleString::subString(size_t beginPos, size_t amount) const
{
    if (beginPos > size()-1) return "";

    SimpleString newString = getBuffer() + beginPos;

    if (newString.size() > amount)
        newString.buffer_[amount] = '\0';

    return newString;
}